

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall ot::commissioner::Interpreter::PrintOrExport(Interpreter *this,Value *aValue)

{
  bool bVar1;
  size_type sVar2;
  StringArray *this_00;
  string *aLine;
  ulong uVar3;
  Error *aOther;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view fmt;
  format_args args;
  undefined1 local_288 [4];
  Color color;
  anon_class_1_0_00000001 local_25a;
  v10 local_259;
  v10 *local_258;
  char *local_250;
  undefined1 local_248 [8];
  string out;
  string local_200;
  Error local_1e0;
  int local_1b4;
  Error local_1b0;
  Error local_188;
  undefined1 local_160 [8];
  string filePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end3;
  iterator __begin3;
  StringArray *__range3;
  Error error;
  undefined1 local_e8 [8];
  string output;
  Value *aValue_local;
  Interpreter *this_local;
  undefined1 local_a0 [16];
  v10 *local_90;
  char *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  v10 *local_78;
  char *pcStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  v10 *local_60;
  v10 **local_58;
  Interpreter **local_50;
  undefined1 *local_48;
  Interpreter **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  Interpreter **local_28;
  v10 **local_20;
  v10 *local_18;
  char *pcStack_10;
  
  output.field_2._8_8_ = aValue;
  Value::ToString_abi_cxx11_((string *)local_e8,aValue);
  bVar1 = Value::HasNoError((Value *)output.field_2._8_8_);
  if ((bVar1) &&
     (sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->mContext).mExportFiles), sVar2 != 0)) {
    Error::Error((Error *)&__range3);
    this_00 = &(this->mContext).mExportFiles;
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    path = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&path), bVar1) {
      filePath.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end3);
      std::__cxx11::string::string((string *)local_160,(string *)filePath.field_2._8_8_);
      RestoreFilePath(&local_188,(string *)filePath.field_2._8_8_);
      Error::operator=((Error *)&__range3,&local_188);
      Error::~Error(&local_188);
      Error::Error(&local_1b0);
      bVar1 = Error::operator!=((Error *)&__range3,&local_1b0);
      Error::~Error(&local_1b0);
      if (bVar1) {
        aLine = Error::GetMessage_abi_cxx11_((Error *)&__range3);
        Console::Write(aLine,kRed);
        local_1b4 = 2;
      }
      else {
        Value::ToString_abi_cxx11_(&local_200,(Value *)output.field_2._8_8_);
        WriteFile(&local_1e0,&local_200,(string *)local_160);
        Error::operator=((Error *)&__range3,&local_1e0);
        Error::~Error(&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        Error::Error((Error *)((long)&out.field_2 + 8));
        aOther = (Error *)((long)&out.field_2 + 8);
        bVar1 = Error::operator!=((Error *)&__range3,aOther);
        Error::~Error((Error *)((long)&out.field_2 + 8));
        if (bVar1) {
          PrintOrExport::anon_class_1_0_00000001::operator()(&local_25a);
          local_58 = &local_258;
          local_60 = &local_259;
          bVar5 = ::fmt::v10::operator()(local_60);
          local_250 = (char *)bVar5.size_;
          local_258 = (v10 *)bVar5.data_;
          ::fmt::v10::detail::
          check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                    ();
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
          local_78 = local_258;
          pcStack_70 = local_250;
          local_80 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_160;
          local_20 = &local_78;
          local_90 = local_258;
          local_88 = local_250;
          local_18 = local_90;
          pcStack_10 = local_88;
          this_local = (Interpreter *)
                       ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                 (local_80,(v10 *)aOther,local_68);
          local_48 = local_a0;
          local_50 = &this_local;
          local_38 = 0xd;
          fmt.size_ = 0xd;
          fmt.data_ = local_88;
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)local_50;
          local_40 = local_50;
          local_30 = local_48;
          local_28 = local_50;
          ::fmt::v10::vformat_abi_cxx11_((string *)local_248,local_90,fmt,args);
          Console::Write((string *)local_248,kRed);
          local_1b4 = 2;
          std::__cxx11::string::~string((string *)local_248);
        }
        else {
          local_1b4 = 0;
        }
      }
      std::__cxx11::string::~string((string *)local_160);
      if (local_1b4 != 0) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    Error::Error((Error *)local_288);
    bVar1 = Error::operator==((Error *)&__range3,(Error *)local_288);
    Error::~Error((Error *)local_288);
    if (bVar1) {
      std::__cxx11::string::clear();
    }
    Error::~Error((Error *)&__range3);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)local_e8,"\n");
  }
  bVar1 = Value::HasNoError((Value *)output.field_2._8_8_);
  pcVar4 = "[failed]";
  if (bVar1) {
    pcVar4 = "[done]";
  }
  std::__cxx11::string::operator+=((string *)local_e8,pcVar4);
  bVar1 = Value::HasNoError((Value *)output.field_2._8_8_);
  Console::Write((string *)local_e8,bVar1 | kRed);
  std::__cxx11::string::~string((string *)local_e8);
  return;
}

Assistant:

void Interpreter::PrintOrExport(const Value &aValue)
{
    std::string output = aValue.ToString();

    if (aValue.HasNoError() && mContext.mExportFiles.size() > 0)
    {
        Error error;

        for (const auto &path : mContext.mExportFiles)
        {
            std::string filePath = path;

            // Make sure folder path exists, if it's not creatable, print error and output to console instead
            error = RestoreFilePath(path);
            if (error != ERROR_NONE)
            {
                Console::Write(error.GetMessage(), Console::Color::kRed);
                break;
            }
            ///
            /// @todo: maybe instead of overwriting an existing file
            ///        suggest a new file name by incrementing suffix
            ///        filePath[-suffix].ext
            ///
            error = WriteFile(aValue.ToString(), filePath);
            if (error != ERROR_NONE)
            {
                std::string out = fmt::format(FMT_STRING("failed to write to '{}'\n"), filePath);
                Console::Write(out, Console::Color::kRed);
                break;
            }
        }
        if (error == ERROR_NONE)
        {
            // value is written to file, no console output expected other than
            // [done]/[failed]
            output.clear();
        }
    }
    if (!output.empty())
    {
        output += "\n";
    }
    output += aValue.HasNoError() ? "[done]" : "[failed]";
    auto color = aValue.HasNoError() ? Console::Color::kGreen : Console::Color::kRed;

    Console::Write(output, color);
}